

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::baggage::anon_unknown_3::TestStatsReporter::incCounter
          (TestStatsReporter *this,string *name,int64_t delta,TagMap *tags)

{
  mapped_type *pmVar1;
  string metricName;
  key_type kStack_48;
  
  std::mutex::lock(&this->_mutex);
  jaegertracing::metrics::Metrics::addTagsToMetricName((string *)&kStack_48,(unordered_map *)name);
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->_counters,&kStack_48);
  *pmVar1 = *pmVar1 + delta;
  std::__cxx11::string::~string((string *)&kStack_48);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return;
}

Assistant:

void incCounter(const std::string& name,
                    int64_t delta,
                    const metrics::StatsReporter::TagMap& tags) override
    {
        std::lock_guard<std::mutex> lock(_mutex);

        const auto metricName =
            metrics::Metrics::addTagsToMetricName(name, tags);
        auto& currentValue = _counters[metricName];
        currentValue = currentValue + delta;
    }